

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_istream<char,_std::char_traits<char>_> *is,basic_json_decode_options<char> *options)

{
  ser_error *this_00;
  error_category *peVar1;
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar2;
  error_code ec;
  allocator<char> local_371;
  string local_370;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> reader;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&decoder,(allocator_type *)&reader,(temp_allocator_type *)&local_370);
  basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
  basic_json_reader<std::istream&>
            ((basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>> *)&reader,
             is,&decoder.super_basic_json_visitor<char>,options,(allocator<char> *)&local_370);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::read_next(&reader);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done(&reader)
  ;
  if (decoder.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::
    ~basic_json_reader(&reader);
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::~json_decoder(&decoder);
    bVar2.field_0.int64_.val_ = extraout_RDX;
    bVar2.field_0._0_8_ = this;
    return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar2.field_0;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar1 = json_error_category();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"Failed to parse json stream",&local_371);
  ec._M_cat = peVar1;
  ec._0_8_ = 2;
  ser_error::ser_error(this_00,ec,&local_370);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

static basic_json parse(std::basic_istream<char_type>& is, 
            const basic_json_decode_options<char_type>& options = basic_json_options<CharT>())
        {
            json_decoder<basic_json> decoder;
            basic_json_reader<char_type,stream_source<char_type>,Allocator> reader(is, decoder, options);
            reader.read_next();
            reader.check_done();
            if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(json_errc::source_error, "Failed to parse json stream"));
            }
            return decoder.get_result();
        }